

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

int xpath_count(lyxp_set **args,uint16_t UNUSED_arg_count,lyd_node *UNUSED_cur_node,
               lys_module *UNUSED_local_mod,lyxp_set *set,int UNUSED_options)

{
  char *pcVar1;
  longdouble number;
  
  switch((*args)->type) {
  case LYXP_SET_EMPTY:
    number = (longdouble)0;
    goto LAB_001707bf;
  case LYXP_SET_NODE_SET:
    number = (longdouble)(*args)->used;
LAB_001707bf:
    set_fill_number(set,number);
    return 0;
  case LYXP_SET_SNODE_SET:
    pcVar1 = "schema node set";
    break;
  case LYXP_SET_BOOLEAN:
    pcVar1 = "boolean";
    break;
  case LYXP_SET_NUMBER:
    pcVar1 = "number";
    break;
  case LYXP_SET_STRING:
    pcVar1 = "string";
    break;
  default:
    pcVar1 = (char *)0x0;
  }
  ly_vlog(LYE_XPATH_INARGTYPE,LY_VLOG_NONE,(void *)0x0,1,pcVar1,"count(node-set)");
  return -1;
}

Assistant:

static int
xpath_count(struct lyxp_set **args, uint16_t UNUSED(arg_count), struct lyd_node *UNUSED(cur_node),
            struct lys_module *UNUSED(local_mod), struct lyxp_set *set, int UNUSED(options))
{
    if (args[0]->type == LYXP_SET_EMPTY) {
        set_fill_number(set, 0);
        return EXIT_SUCCESS;
    }

    if (args[0]->type != LYXP_SET_NODE_SET) {
        LOGVAL(LYE_XPATH_INARGTYPE, LY_VLOG_NONE, NULL, 1, print_set_type(args[0]), "count(node-set)");
        return -1;
    }

    set_fill_number(set, args[0]->used);
    return EXIT_SUCCESS;
}